

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdDecodeEx2(INSTRUX *Instrux,ND_UINT8 *Code,ND_SIZET Size,ND_UINT8 DefCode,ND_UINT8 DefData
                    ,ND_UINT8 DefStack,ND_UINT8 Vendor)

{
  ulong uVar1;
  NDSTATUS NVar2;
  long in_FS_OFFSET;
  ND_UINT8 DefStack_local;
  ND_UINT8 DefData_local;
  ND_UINT8 DefCode_local;
  ND_SIZET Size_local;
  ND_UINT8 *Code_local;
  INSTRUX *Instrux_local;
  ND_CONTEXT opt;
  
  opt._8_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  NdInitContext((ND_CONTEXT *)&Instrux_local);
  uVar1 = (ulong)Instrux_local >> 0x18;
  Instrux_local._0_3_ =
       CONCAT12(0xff,DefCode & 0xf | (DefData & 0xf) << 4 | (DefStack & 0xf) << 8 |
                     (ushort)Vendor << 0xc);
  Instrux_local = (INSTRUX *)CONCAT53((int5)uVar1,Instrux_local._0_3_);
  NVar2 = NdDecodeWithContext(Instrux,Code,Size,(ND_CONTEXT *)&Instrux_local);
  if (*(long *)(in_FS_OFFSET + 0x28) == opt._8_8_) {
    return NVar2;
  }
  __stack_chk_fail();
}

Assistant:

NDSTATUS
NdDecodeEx2(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_SIZET Size,
    ND_UINT8 DefCode,
    ND_UINT8 DefData,
    ND_UINT8 DefStack,
    ND_UINT8 Vendor
    )
{
    ND_CONTEXT opt;

    NdInitContext(&opt);

    opt.DefCode = DefCode;
    opt.DefData = DefData;
    opt.DefStack = DefStack;
    opt.VendMode = Vendor;
    opt.FeatMode = ND_FEAT_ALL; // Optimistically decode everything, as if all features are enabled.

    return NdDecodeWithContext(Instrux, Code, Size, &opt);
}